

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# binary_executor.hpp
# Opt level: O3

idx_t duckdb::BinaryExecutor::
      SelectFlatLoop<duckdb::hugeint_t,duckdb::hugeint_t,duckdb::GreaterThanEquals,true,false,false,true>
                (hugeint_t *ldata,hugeint_t *rdata,SelectionVector *sel,idx_t count,
                ValidityMask *validity_mask,SelectionVector *true_sel,SelectionVector *false_sel)

{
  unsigned_long *puVar1;
  sel_t *psVar2;
  sel_t *psVar3;
  long lVar4;
  long lVar5;
  sel_t sVar6;
  ulong uVar7;
  ulong uVar8;
  ulong uVar9;
  long lVar10;
  int64_t *piVar11;
  ulong uVar12;
  ulong uVar13;
  ulong uVar14;
  
  if (count + 0x3f < 0x40) {
    lVar10 = 0;
  }
  else {
    puVar1 = (validity_mask->super_TemplatedValidityMask<unsigned_long>).validity_mask;
    lVar10 = 0;
    uVar13 = 0;
    uVar14 = 0;
    do {
      if (puVar1 == (unsigned_long *)0x0) {
        uVar7 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar7 = count;
        }
LAB_0149c166:
        uVar12 = uVar14;
        if (uVar14 < uVar7) {
          psVar2 = sel->sel_vector;
          uVar8 = ldata->lower;
          lVar4 = ldata->upper;
          psVar3 = false_sel->sel_vector;
          piVar11 = &rdata[uVar14].upper;
          do {
            uVar12 = uVar14;
            if (psVar2 != (sel_t *)0x0) {
              uVar12 = (ulong)psVar2[uVar14];
            }
            lVar5 = *piVar11;
            uVar9 = ((hugeint_t *)(piVar11 + -1))->lower;
            psVar3[lVar10] = (sel_t)uVar12;
            lVar10 = lVar10 + (ulong)(uVar8 < uVar9 && lVar5 == lVar4 ||
                                     lVar5 != lVar4 && lVar4 <= lVar5);
            uVar14 = uVar14 + 1;
            piVar11 = piVar11 + 2;
            uVar12 = uVar7;
          } while (uVar7 != uVar14);
        }
      }
      else {
        uVar8 = puVar1[uVar13];
        uVar7 = uVar14 + 0x40;
        if (count <= uVar14 + 0x40) {
          uVar7 = count;
        }
        if (uVar8 == 0xffffffffffffffff) goto LAB_0149c166;
        uVar12 = uVar7;
        if (uVar8 == 0) {
          if (uVar14 < uVar7) {
            psVar2 = sel->sel_vector;
            psVar3 = false_sel->sel_vector;
            do {
              uVar8 = uVar14;
              if (psVar2 != (sel_t *)0x0) {
                uVar8 = (ulong)psVar2[uVar14];
              }
              psVar3[lVar10] = (sel_t)uVar8;
              lVar10 = lVar10 + 1;
              uVar14 = uVar14 + 1;
            } while (uVar7 != uVar14);
          }
        }
        else {
          uVar12 = uVar14;
          if (uVar14 < uVar7) {
            psVar2 = sel->sel_vector;
            psVar3 = false_sel->sel_vector;
            piVar11 = &rdata[uVar14].upper;
            uVar9 = 0;
            do {
              if (psVar2 == (sel_t *)0x0) {
                sVar6 = (int)uVar14 + (int)uVar9;
              }
              else {
                sVar6 = psVar2[uVar14 + uVar9];
              }
              if ((uVar8 >> (uVar9 & 0x3f) & 1) == 0) {
                uVar12 = 1;
              }
              else {
                lVar4 = *piVar11;
                lVar5 = ldata->upper;
                uVar12 = (ulong)(ldata->lower < ((hugeint_t *)(piVar11 + -1))->lower &&
                                 lVar4 == lVar5 || lVar4 != lVar5 && lVar5 <= lVar4);
              }
              psVar3[lVar10] = sVar6;
              lVar10 = lVar10 + uVar12;
              uVar9 = uVar9 + 1;
              piVar11 = piVar11 + 2;
              uVar12 = uVar7;
            } while (uVar7 - uVar14 != uVar9);
          }
        }
      }
      uVar13 = uVar13 + 1;
      uVar14 = uVar12;
    } while (uVar13 != count + 0x3f >> 6);
  }
  return count - lVar10;
}

Assistant:

static inline idx_t SelectFlatLoop(const LEFT_TYPE *__restrict ldata, const RIGHT_TYPE *__restrict rdata,
	                                   const SelectionVector *sel, idx_t count, ValidityMask &validity_mask,
	                                   SelectionVector *true_sel, SelectionVector *false_sel) {
		idx_t true_count = 0, false_count = 0;
		idx_t base_idx = 0;
		auto entry_count = ValidityMask::EntryCount(count);
		for (idx_t entry_idx = 0; entry_idx < entry_count; entry_idx++) {
			auto validity_entry = validity_mask.GetValidityEntry(entry_idx);
			idx_t next = MinValue<idx_t>(base_idx + ValidityMask::BITS_PER_VALUE, count);
			if (ValidityMask::AllValid(validity_entry)) {
				// all valid: perform operation
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			} else if (ValidityMask::NoneValid(validity_entry)) {
				// nothing valid: skip all
				if (HAS_FALSE_SEL) {
					for (; base_idx < next; base_idx++) {
						idx_t result_idx = sel->get_index(base_idx);
						false_sel->set_index(false_count, result_idx);
						false_count++;
					}
				}
				base_idx = next;
				continue;
			} else {
				// partially valid: need to check individual elements for validity
				idx_t start = base_idx;
				for (; base_idx < next; base_idx++) {
					idx_t result_idx = sel->get_index(base_idx);
					idx_t lidx = LEFT_CONSTANT ? 0 : base_idx;
					idx_t ridx = RIGHT_CONSTANT ? 0 : base_idx;
					bool comparison_result = ValidityMask::RowIsValid(validity_entry, base_idx - start) &&
					                         OP::Operation(ldata[lidx], rdata[ridx]);
					if (HAS_TRUE_SEL) {
						true_sel->set_index(true_count, result_idx);
						true_count += comparison_result;
					}
					if (HAS_FALSE_SEL) {
						false_sel->set_index(false_count, result_idx);
						false_count += !comparison_result;
					}
				}
			}
		}
		if (HAS_TRUE_SEL) {
			return true_count;
		} else {
			return count - false_count;
		}
	}